

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes ReadNumber(CSzData *sd,UInt64 *value)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  bool bVar5;
  SRes SVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  sVar3 = sd->Size;
  SVar6 = 0x10;
  if (sVar3 != 0) {
    sd->Size = sVar3 - 1;
    pbVar4 = sd->Data;
    sd->Data = pbVar4 + 1;
    bVar1 = *pbVar4;
    uVar8 = (uint)bVar1;
    if (-1 < (char)bVar1) {
LAB_005cd102:
      *value = (ulong)uVar8;
      return 0;
    }
    if (sVar3 - 1 != 0) {
      sd->Size = sVar3 - 2;
      sd->Data = pbVar4 + 2;
      bVar2 = pbVar4[1];
      uVar10 = (uint)bVar2;
      if ((bVar1 & 0x40) == 0) {
        uVar8 = (uVar8 & 0x3f) << 8 | uVar10;
        goto LAB_005cd102;
      }
      if (sVar3 - 2 != 0) {
        sd->Size = sVar3 - 3;
        sd->Data = pbVar4 + 3;
        *value = (ulong)CONCAT11(pbVar4[2],bVar2);
        uVar9 = 0x20;
        lVar7 = 0x10;
        do {
          if ((uVar9 & uVar8) == 0) {
            *value = *value | (ulong)(uVar9 - 1 & uVar8) << ((byte)lVar7 & 0x3f);
            bVar5 = false;
            uVar10 = 0;
          }
          else if (sd->Size == 0) {
            uVar10 = 0x10;
            bVar5 = false;
          }
          else {
            sd->Size = sd->Size - 1;
            pbVar4 = sd->Data;
            sd->Data = pbVar4 + 1;
            *value = *value | (ulong)*pbVar4 << ((byte)lVar7 & 0x3f);
            uVar9 = uVar9 >> 1;
            bVar5 = true;
          }
          if (!bVar5) {
            return uVar10;
          }
          lVar7 = lVar7 + 8;
          SVar6 = 0;
        } while (lVar7 != 0x40);
      }
    }
  }
  return SVar6;
}

Assistant:

static MY_NO_INLINE SRes ReadNumber(CSzData *sd, UInt64 *value)
{
  Byte firstByte, mask;
  unsigned i;
  UInt32 v;

  SZ_READ_BYTE(firstByte);
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    return SZ_OK;
  }
  SZ_READ_BYTE(v);
  if ((firstByte & 0x40) == 0)
  {
    *value = (((UInt32)firstByte & 0x3F) << 8) | v;
    return SZ_OK;
  }
  SZ_READ_BYTE(mask);
  *value = v | ((UInt32)mask << 8);
  mask = 0x20;
  for (i = 2; i < 8; i++)
  {
    Byte b;
    if ((firstByte & mask) == 0)
    {
      UInt64 highPart = (unsigned)firstByte & (unsigned)(mask - 1);
      *value |= (highPart << (8 * i));
      return SZ_OK;
    }
    SZ_READ_BYTE(b);
    *value |= ((UInt64)b << (8 * i));
    mask >>= 1;
  }
  return SZ_OK;
}